

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitSIMDTernary(PrintExpressionContents *this,SIMDTernary *curr)

{
  long lVar1;
  char *pcVar2;
  ostream *poVar3;
  
  poVar3 = this->o;
  Colors::outputColorCode(poVar3,"\x1b[35m");
  Colors::outputColorCode(poVar3,"\x1b[1m");
  switch(curr->op) {
  case Bitselect:
    poVar3 = this->o;
    pcVar2 = "v128.bitselect";
    lVar1 = 0xe;
    goto LAB_00a3033b;
  case RelaxedMaddVecF16x8:
    poVar3 = this->o;
    pcVar2 = "f16x8.relaxed_madd";
    goto LAB_00a30305;
  case RelaxedNmaddVecF16x8:
    poVar3 = this->o;
    pcVar2 = "f16x8.relaxed_nmadd";
    goto LAB_00a30317;
  case RelaxedMaddVecF32x4:
    poVar3 = this->o;
    pcVar2 = "f32x4.relaxed_madd";
    goto LAB_00a30305;
  case RelaxedNmaddVecF32x4:
    poVar3 = this->o;
    pcVar2 = "f32x4.relaxed_nmadd";
    goto LAB_00a30317;
  case RelaxedMaddVecF64x2:
    poVar3 = this->o;
    pcVar2 = "f64x2.relaxed_madd";
LAB_00a30305:
    lVar1 = 0x12;
    goto LAB_00a3033b;
  case RelaxedNmaddVecF64x2:
    poVar3 = this->o;
    pcVar2 = "f64x2.relaxed_nmadd";
LAB_00a30317:
    lVar1 = 0x13;
    goto LAB_00a3033b;
  case LaneselectI8x16:
    poVar3 = this->o;
    pcVar2 = "i8x16.laneselect";
    break;
  case LaneselectI16x8:
    poVar3 = this->o;
    pcVar2 = "i16x8.laneselect";
    break;
  case LaneselectI32x4:
    poVar3 = this->o;
    pcVar2 = "i32x4.laneselect";
    break;
  case LaneselectI64x2:
    poVar3 = this->o;
    pcVar2 = "i64x2.laneselect";
    break;
  case DotI8x16I7x16AddSToVecI32x4:
    poVar3 = this->o;
    pcVar2 = "i32x4.dot_i8x16_i7x16_add_s";
    lVar1 = 0x1b;
    goto LAB_00a3033b;
  default:
    goto switchD_00a30280_default;
  }
  lVar1 = 0x10;
LAB_00a3033b:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,lVar1);
switchD_00a30280_default:
  Colors::outputColorCode(this->o,"\x1b[0m");
  return;
}

Assistant:

void visitSIMDTernary(SIMDTernary* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Bitselect:
        o << "v128.bitselect";
        break;
      case LaneselectI8x16:
        o << "i8x16.laneselect";
        break;
      case LaneselectI16x8:
        o << "i16x8.laneselect";
        break;
      case LaneselectI32x4:
        o << "i32x4.laneselect";
        break;
      case LaneselectI64x2:
        o << "i64x2.laneselect";
        break;
      case RelaxedMaddVecF16x8:
        o << "f16x8.relaxed_madd";
        break;
      case RelaxedNmaddVecF16x8:
        o << "f16x8.relaxed_nmadd";
        break;
      case RelaxedMaddVecF32x4:
        o << "f32x4.relaxed_madd";
        break;
      case RelaxedNmaddVecF32x4:
        o << "f32x4.relaxed_nmadd";
        break;
      case RelaxedMaddVecF64x2:
        o << "f64x2.relaxed_madd";
        break;
      case RelaxedNmaddVecF64x2:
        o << "f64x2.relaxed_nmadd";
        break;
      case DotI8x16I7x16AddSToVecI32x4:
        o << "i32x4.dot_i8x16_i7x16_add_s";
        break;
    }
    restoreNormalColor(o);
  }